

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::TLVWriter::TLVWriter(TLVWriter *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  _Rb_tree_header *p_Var1;
  
  Kumu::MemIOWriter::MemIOWriter(&this->super_MemIOWriter,p,c);
  p_Var1 = &(this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_Lookup = PrimerLookup;
  if (3 < c) {
    return;
  }
  __assert_fail("c > 3",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXFTypes.cpp"
                ,0x24d,"ASDCP::MXF::TLVWriter::TLVWriter(byte_t *, ui32_t, IPrimerLookup *)");
}

Assistant:

ASDCP::MXF::TLVWriter::TLVWriter(byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOWriter(p, c), m_Lookup(PrimerLookup)
{
  assert(c > 3);
}